

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

Vector3f __thiscall BRDFMaterial::BRDF(BRDFMaterial *this,Vector3f *in,Vector3f *out,Hit *hit)

{
  float *pfVar1;
  Vector3f *in_RSI;
  Vector3f *in_RDI;
  float f;
  undefined8 uVar2;
  Vector3f VVar4;
  Vector3f VVar5;
  float G;
  Vector3f F;
  float u;
  float D;
  float nhh;
  float LH;
  float VN;
  float VH;
  float HN;
  Vector3f H;
  Vector3f V;
  Vector3f R;
  float LN;
  Vector3f N;
  Vector3f L;
  Vector3f *in_stack_fffffffffffffe88;
  float *rv;
  Vector3f *in_stack_fffffffffffffe90;
  float *this_00;
  Vector3f *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  Vector3f *v1;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  Vector3f local_d4 [5];
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  Vector2f *in_stack_ffffffffffffffa0;
  Texture *in_stack_ffffffffffffffa8;
  undefined8 uVar6;
  float fVar3;
  float fVar7;
  
  v1 = in_RDI;
  VVar4 = Vector3f::normalized(in_RDI);
  fVar3 = VVar4.m_elements[2];
  Vector3f::Vector3f(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  f = Vector3f::dot((Vector3f *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    in_stack_fffffffffffffe98);
  uVar2 = 0;
  if (0.0 < f) {
    ::operator*((float)((ulong)in_RDI >> 0x20),
                (Vector3f *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    ::operator-(in_RSI,v1);
    ::operator-(in_stack_fffffffffffffe98);
    Vector3f::normalize(in_stack_fffffffffffffe90);
    VVar4 = ::operator+(in_RSI,v1);
    fVar3 = VVar4.m_elements[2];
    Vector3f::normalize(in_stack_fffffffffffffe90);
    local_78 = Vector3f::dot((Vector3f *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98);
    local_7c = Vector3f::dot((Vector3f *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98);
    local_80 = Vector3f::dot((Vector3f *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98);
    local_84 = Vector3f::dot((Vector3f *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98);
    uVar2 = 0;
    if (0.0 <= local_80) {
      local_88 = local_78 * local_78;
      local_8c = expf((local_88 - 1.0) /
                      (in_RSI[0x12].m_elements[0] * in_RSI[0x12].m_elements[0] * local_88));
      local_8c = local_8c /
                 (in_RSI[0x12].m_elements[0] * in_RSI[0x12].m_elements[0] * local_88 * local_88);
      fVar3 = (1.0 - local_80) * (1.0 - local_80);
      local_90 = (1.0 - local_80) * fVar3 * fVar3;
      rv = in_RSI[9].m_elements + 1;
      Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffe90,(Vector2f *)rv);
      Texture::get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      Vector3f::Vector3f(local_d4,1.0);
      this_00 = in_RSI[9].m_elements + 1;
      Vector2f::Vector2f((Vector2f *)this_00,(Vector2f *)rv);
      Texture::get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      ::operator-(in_RSI,v1);
      ::operator*(in_RDI,in_stack_fffffffffffffea4);
      ::operator+(in_RSI,v1);
      local_f4 = (local_78 * local_80) / local_7c;
      local_f8 = (local_78 * f) / local_7c;
      pfVar1 = std::min<float>(&local_f4,&local_f8);
      local_f0 = *pfVar1 * 2.0;
      local_fc = 1.0;
      pfVar1 = std::min<float>(&local_f0,&local_fc);
      local_ec = *pfVar1;
      Vector2f::Vector2f((Vector2f *)this_00,(Vector2f *)rv);
      Texture::get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      ::operator*((float)((ulong)in_RDI >> 0x20),(Vector3f *)CONCAT44(f,in_stack_fffffffffffffea0));
      ::operator*((float)((ulong)in_RDI >> 0x20),(Vector3f *)CONCAT44(f,in_stack_fffffffffffffea0));
      ::operator*(in_RDI,f);
      operator/(in_RDI,f);
      VVar4 = ::operator+(in_RSI,v1);
    }
    else {
      Vector3f::Vector3f(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      VVar4.m_elements[2] = fVar3;
      VVar4.m_elements[0] = (float)(int)uVar2;
      VVar4.m_elements[1] = (float)(int)((ulong)uVar2 >> 0x20);
    }
  }
  else {
    Vector3f::Vector3f(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    VVar4.m_elements[2] = fVar3;
    VVar4.m_elements[0] = (float)(int)uVar2;
    VVar4.m_elements[1] = (float)(int)((ulong)uVar2 >> 0x20);
  }
  VVar5.m_elements[0] = VVar4.m_elements[0];
  uVar6._4_4_ = VVar4.m_elements[1];
  register0x00001240 = VVar4.m_elements[2];
  return (Vector3f)VVar5.m_elements;
}

Assistant:

Vector3f BRDF(const Vector3f& in, const Vector3f& out, const Hit& hit) const {
		Vector3f L = out.normalized();
		Vector3f N = hit.norm;
		float LN = Vector3f::dot(L, N);
		if (LN <= 0) return Vector3f::ZERO;
		Vector3f R = 2 * LN * N - L, V = -in; V.normalize();
		Vector3f H = L + V; H.normalize();
		float HN = Vector3f::dot(H, N), VH = Vector3f::dot(V, H),
			VN = Vector3f::dot(V, N), LH = Vector3f::dot(L, H);
		if (VN < 0) return Vector3f::ZERO; //?
		float nhh = HN * HN;
		float D = expf((nhh - 1) / (roughness * roughness * nhh)) / (roughness * roughness * nhh * nhh);
		//		float D = roughness * roughness / (PI * td * td);
		float u = 1 - VN; //u^5
		u *= u; u *= u; u *= 1 - VN;
		Vector3f F = specularColor.get(hit.pos) + (1 - specularColor.get(hit.pos)) * u;
		float G = std::min(std::min(HN * VN / VH, HN * LN / VH) * 2, float(1));
		return LN * diffuseColor.get(hit.pos)
			+ D * F * G / (4 * VN);
	}